

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_register_simple_type_op(sexp ctx,sexp self,sexp_sint_t n,sexp name,sexp parent,sexp slots)

{
  ushort uVar1;
  sexp psVar2;
  sexp psVar3;
  sexp psVar4;
  sexp_sint_t n_00;
  sexp_sint_t extraout_RDX;
  sexp_sint_t n_01;
  sexp_sint_t extraout_RDX_00;
  short sVar5;
  int iVar6;
  long lVar7;
  
  psVar4 = ctx;
  psVar2 = sexp_length_op(ctx,self,n,slots);
  sVar5 = (short)((ulong)psVar2 >> 1);
  if ((((ulong)parent & 3) == 0 && parent != (sexp)0x0) && (parent->tag == 1)) {
    psVar3 = sexp_length_op(psVar4,self,n_00,(parent->value).type.slots);
    iVar6 = (int)((ulong)psVar2 >> 1) + ((uint)((ulong)psVar3 >> 1) & 0x7fffffff);
    sVar5 = (short)iVar6;
    psVar2 = (parent->value).type.cpl;
    if ((((ulong)psVar2 & 3) == 0) &&
       ((psVar2->tag == 10 && (uVar1 = *(short *)&psVar2->value - 1, -1 < (short)uVar1)))) {
      lVar7 = (ulong)uVar1 + 2;
      n_01 = extraout_RDX;
      do {
        psVar3 = sexp_length_op(psVar4,self,n_01,
                                *(sexp *)(*(long *)(&psVar2->tag + lVar7 * 2) + 0x18));
        iVar6 = iVar6 + ((uint)((ulong)psVar3 >> 1) & 0x7fffffff);
        sVar5 = (short)iVar6;
        lVar7 = lVar7 + -1;
        n_01 = extraout_RDX_00;
      } while (lVar7 != 1);
    }
  }
  psVar4 = (sexp)((long)sVar5 * 2 | 1);
  psVar4 = sexp_register_type_op
                     (ctx,(sexp)0x0,1,name,parent,slots,(sexp)&DAT_00000011,psVar4,psVar4,
                      (sexp)&DAT_00000001,(sexp)&DAT_00000001,(sexp)((long)sVar5 * 0x10 + 0x11),
                      (sexp)&DAT_00000001,(sexp)&DAT_00000001,(sexp)&DAT_00000001,
                      (sexp)&DAT_00000001,(sexp)&DAT_00000001,(sexp)&DAT_00000001,
                      (sexp)&DAT_00000001,
                      (sexp)((((ctx->value).type.setters)->value).port.stream)->_freeres_list->
                            _IO_buf_base,(char *)0x0,(sexp_proc2)0x0);
  return psVar4;
}

Assistant:

sexp sexp_register_simple_type_op (sexp ctx, sexp self, sexp_sint_t n, sexp name, sexp parent, sexp slots) {
  short i, num_slots = (short)sexp_unbox_fixnum(sexp_length(ctx, slots));
  sexp type_size, num_slots_obj, cpl, tmp;
  if (parent && sexp_typep(parent)) {
    num_slots += (short)sexp_unbox_fixnum(sexp_length(ctx, sexp_type_slots(parent)));
    if (sexp_vectorp((cpl = sexp_type_cpl(parent))))
      for (i=(short)sexp_vector_length(cpl)-1; i>=0; i--) {
        tmp = sexp_vector_ref(cpl, sexp_make_fixnum(i));
        num_slots += (short)sexp_unbox_fixnum(sexp_length(ctx, sexp_type_slots(tmp)));
      }
  }
  num_slots_obj = sexp_make_fixnum(num_slots);
  type_size = sexp_make_fixnum(sexp_sizeof_header + sizeof(sexp)*num_slots);
  return
    sexp_register_type(ctx, name, parent, slots,
                       sexp_make_fixnum(sexp_offsetof_slot0),
                       num_slots_obj, num_slots_obj, SEXP_ZERO, SEXP_ZERO,
                       type_size, SEXP_ZERO, SEXP_ZERO, SEXP_ZERO, SEXP_ZERO,
                       SEXP_ZERO, SEXP_ZERO, SEXP_ZERO,
                       sexp_type_print(sexp_type_by_index(ctx, SEXP_EXCEPTION)),
                       NULL, NULL);
}